

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndLiteralSelector.cpp
# Opt level: O2

LiteralList * __thiscall
Kernel::RndLiteralSelector::getMaximalsInOrder(RndLiteralSelector *this,Clause *c,uint eligible)

{
  ulong uVar1;
  List<Kernel::Literal_*> *local_20;
  
  local_20 = (List<Kernel::Literal_*> *)0x0;
  for (uVar1 = (ulong)eligible; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    local_20 = Lib::List<Kernel::Literal_*>::cons(c->_literals[uVar1 - 1],local_20);
  }
  Ordering::removeNonMaximal((this->super_LiteralSelector)._ord,&local_20);
  return local_20;
}

Assistant:

LiteralList* RndLiteralSelector::getMaximalsInOrder(Clause* c, unsigned eligible)
{
  LiteralList* res = LiteralList::empty();

  for(int li=((int)eligible)-1; li>=0; li--) {
    LiteralList::push((*c)[li],res);
  }

  _ord.removeNonMaximal(res);

  return res;
}